

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_valddi.cpp
# Opt level: O2

ze_result_t
validation_layer::zesVFManagementGetVFCapabilitiesExp
          (zes_vf_handle_t hVFhandle,zes_vf_exp_capabilities_t *pCapability)

{
  Logger *this;
  long *plVar1;
  long lVar2;
  ze_result_t result;
  ze_result_t zVar3;
  size_t i;
  long lVar4;
  long lVar5;
  allocator local_59;
  code *local_58;
  string local_50;
  
  lVar2 = context;
  this = *(Logger **)(context + 0xd50);
  std::__cxx11::string::string
            ((string *)&local_50,"zesVFManagementGetVFCapabilitiesExp(hVFhandle, pCapability)",
             &local_59);
  loader::Logger::log_trace(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (*(code **)(lVar2 + 0xd10) == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar5 = *(long *)(lVar2 + 0xd38) - *(long *)(lVar2 + 0xd30) >> 3;
    lVar4 = 0;
    local_58 = *(code **)(lVar2 + 0xd10);
    do {
      if (lVar5 == lVar4) {
        if ((*(char *)(lVar2 + 4) != '\x01') ||
           (result = ZESHandleLifetimeValidation::zesVFManagementGetVFCapabilitiesExpPrologue
                               ((ZESHandleLifetimeValidation *)(*(long *)(lVar2 + 0xd48) + 8),
                                hVFhandle,pCapability), result == ZE_RESULT_SUCCESS)) {
          zVar3 = (*local_58)(hVFhandle,pCapability);
          lVar4 = 0;
          goto LAB_00173e4f;
        }
        break;
      }
      plVar1 = *(long **)(*(long *)(*(long *)(lVar2 + 0xd30) + lVar4 * 8) + 8);
      result = (**(code **)(*plVar1 + 0x910))(plVar1,hVFhandle,pCapability);
      lVar4 = lVar4 + 1;
    } while (result == ZE_RESULT_SUCCESS);
  }
  goto LAB_00173e7d;
  while( true ) {
    plVar1 = *(long **)(*(long *)(*(long *)(lVar2 + 0xd30) + lVar4 * 8) + 8);
    result = (**(code **)(*plVar1 + 0x918))(plVar1,hVFhandle,pCapability,zVar3);
    lVar4 = lVar4 + 1;
    if (result != ZE_RESULT_SUCCESS) break;
LAB_00173e4f:
    result = zVar3;
    if (lVar5 == lVar4) break;
  }
LAB_00173e7d:
  logAndPropagateResult("zesVFManagementGetVFCapabilitiesExp",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesVFManagementGetVFCapabilitiesExp(
        zes_vf_handle_t hVFhandle,                      ///< [in] Sysman handle for the VF component.
        zes_vf_exp_capabilities_t* pCapability          ///< [in,out] Will contain VF capability.
        )
    {
        context.logger->log_trace("zesVFManagementGetVFCapabilitiesExp(hVFhandle, pCapability)");

        auto pfnGetVFCapabilitiesExp = context.zesDdiTable.VFManagementExp.pfnGetVFCapabilitiesExp;

        if( nullptr == pfnGetVFCapabilitiesExp )
            return logAndPropagateResult("zesVFManagementGetVFCapabilitiesExp", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zesValidation->zesVFManagementGetVFCapabilitiesExpPrologue( hVFhandle, pCapability );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesVFManagementGetVFCapabilitiesExp", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zesHandleLifetime.zesVFManagementGetVFCapabilitiesExpPrologue( hVFhandle, pCapability );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesVFManagementGetVFCapabilitiesExp", result);
        }

        auto driver_result = pfnGetVFCapabilitiesExp( hVFhandle, pCapability );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zesValidation->zesVFManagementGetVFCapabilitiesExpEpilogue( hVFhandle, pCapability ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesVFManagementGetVFCapabilitiesExp", result);
        }


        if( driver_result == ZE_RESULT_SUCCESS && context.enableHandleLifetime ){
            
        }
        return logAndPropagateResult("zesVFManagementGetVFCapabilitiesExp", driver_result);
    }